

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,unsigned_long param,unsigned_long params,unsigned_long params_1,
          unsigned_long params_2)

{
  unsigned_long in_stack_ffffffffffffff98;
  string local_50 [32];
  
  ExceptionFormatValue::ExceptionFormatValue
            ((ExceptionFormatValue *)&stack0xffffffffffffff98,(int64_t)values);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(ExceptionFormatValue *)&stack0xffffffffffffff98);
  ::std::__cxx11::string::~string(local_50);
  ConstructMessageRecursive<unsigned_long,unsigned_long,unsigned_long>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             param,params,params_1,in_stack_ffffffffffffff98);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}